

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

int main(void)

{
  pointer pCVar1;
  bool bVar2;
  Reddit *this;
  Index *this_00;
  _Base_ptr p_Var3;
  string *in_RCX;
  string *args;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_R8;
  pointer this_01;
  format_string_t<std::__cxx11::basic_string<char>_> fmt;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_00;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_01;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_02;
  format_string_t<std::__cxx11::basic_string<char>_&> fmt_03;
  string_view delimiter;
  string_view delimiter_00;
  string reply;
  vector<Comment,_std::allocator<Comment>_> comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> linkedTokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokens;
  undefined1 local_118 [16];
  Linker linker;
  
  configureLogger();
  this = (Reddit *)operator_new(0x70);
  Reddit::Reddit(this);
  reddit = this;
  setupSignalHandler();
  loadData();
  spdlog::info<char[13]>((char (*) [13])"Starting bot");
  Linker::Linker(&linker);
  do {
    Reddit::requestNewComments(&comments,reddit);
    pCVar1 = comments.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = comments.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pCVar1; this_01 = this_01 + 1) {
      tokens._M_t._M_impl._0_8_ = &tokens._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct((ulong)&tokens,'(');
      fmt.str_.size_ = (size_t)&tokens;
      fmt.str_.data_ = (char *)0x7;
      spdlog::info<std::__cxx11::string>((spdlog *)"{}\n\n\n\n\n",fmt,in_RCX);
      std::__cxx11::string::~string((string *)&tokens);
      Comment::toString_abi_cxx11_((string *)&tokens,this_01);
      fmt_00.str_.size_ = (size_t)&tokens;
      fmt_00.str_.data_ = (char *)0xf;
      spdlog::info<std::__cxx11::string>((spdlog *)"new comment:\n{}",fmt_00,in_RCX);
      std::__cxx11::string::~string((string *)&tokens);
      this_00 = getIndex(&this_01->threadId);
      Index::addToIndex(this_00,this_01);
      lookForBotCommands(this_01);
      Comment::extractTokens(&tokens,this_01);
      if (tokens._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        spdlog::info<char[21]>((char (*) [21])"no tokens in comment");
      }
      else {
        in_RCX = (string *)&linkedTokens;
        delimiter._M_str = (char *)&tokens;
        delimiter._M_len = (size_t)"\n";
        args = (string *)&tokens;
        str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
                  (in_RCX,(str *)0x1,delimiter,in_R8);
        fmt_01.str_.size_ = (size_t)in_RCX;
        fmt_01.str_.data_ = (char *)0x15;
        spdlog::info<std::__cxx11::string>((spdlog *)"tokens in comment: {}",fmt_01,args);
        std::__cxx11::string::~string((string *)in_RCX);
        Linker::getLinkedTokens
                  ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)in_RCX,
                   &linker,&tokens);
        delimiter_00._M_str = (char *)in_RCX;
        delimiter_00._M_len = (size_t)"\n";
        str::join<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                  (&reply,(str *)0x1,delimiter_00,
                   (set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)in_R8);
        fmt_02.str_.size_ = (size_t)&reply;
        fmt_02.str_.data_ = (char *)0x11;
        spdlog::info<std::__cxx11::string>((spdlog *)"linked tokens: {}",fmt_02,in_RCX);
        std::__cxx11::string::~string((string *)&reply);
        bVar2 = allLinksKnownInThread(&linkedTokens,&this_01->threadId);
        if (bVar2) {
          spdlog::info<char[18]>((char (*) [18])"No tokens to link");
        }
        else {
          replyMessage_abi_cxx11_(&reply,&linkedTokens);
          fmt_03.str_.size_ = (size_t)&reply;
          fmt_03.str_.data_ = (char *)0x12;
          spdlog::info<std::__cxx11::string&>((spdlog *)"Possible reply:\n{}",fmt_03,in_RCX);
          bVar2 = isReplyAllowed(this_01);
          if (bVar2) {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)reply._M_dataplus._M_p == &reply.field_2) {
              local_198.field_2._8_8_ = reply.field_2._8_8_;
            }
            else {
              local_198._M_dataplus._M_p = reply._M_dataplus._M_p;
            }
            local_198.field_2._M_allocated_capacity._1_7_ =
                 reply.field_2._M_allocated_capacity._1_7_;
            local_198.field_2._M_local_buf[0] = reply.field_2._M_local_buf[0];
            local_198._M_string_length = reply._M_string_length;
            reply._M_string_length = 0;
            reply.field_2._M_local_buf[0] = '\0';
            in_RCX = &local_198;
            reply._M_dataplus._M_p = (pointer)&reply.field_2;
            Reddit::comment((Reddit *)local_118,(string *)reddit,&this_01->fullName);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_118);
            std::__cxx11::string::~string((string *)&local_198);
            spdlog::info<char[11]>((char (*) [11])"Reply sent");
            for (p_Var3 = linkedTokens._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var3 != &linkedTokens._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              Index::addToIndex(this_00,(LinkedToken *)(p_Var3 + 1));
            }
          }
          else {
            spdlog::info<char[15]>((char (*) [15])"Reply canceled");
          }
          std::__cxx11::string::~string((string *)&reply);
        }
        std::
        _Rb_tree<LinkedToken,_LinkedToken,_std::_Identity<LinkedToken>,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>
        ::~_Rb_tree(&linkedTokens._M_t);
      }
      std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
      ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
                 *)&tokens);
    }
    std::vector<Comment,_std::allocator<Comment>_>::~vector(&comments);
    tokens._M_t._M_impl._0_8_ = 2;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&tokens);
  } while( true );
}

Assistant:

int main() {
    configureLogger();
    reddit = new Reddit();

    setupSignalHandler();

    // debugComment("t1_jbj1if1");

    loadData();

    spdlog::info("Starting bot");

    Linker linker;
    while (true) {
        try {
            const std::vector<Comment> comments = reddit->requestNewComments();

            for (const Comment& comment : comments) {
                spdlog::info("{}\n\n\n\n\n", std::string(40, '-'));

                spdlog::info("new comment:\n{}", comment.toString());
                Index* index = getIndex(comment.threadId);

                index->addToIndex(comment);
                lookForBotCommands(comment);

                const std::set<Token> tokens = comment.extractTokens();
                if (tokens.size() == 0) {
                    spdlog::info("no tokens in comment");
                    continue;
                }

                spdlog::info("tokens in comment: {}", str::join("\n", tokens));

                const std::set<LinkedToken> linkedTokens = linker.getLinkedTokens(tokens);
                spdlog::info("linked tokens: {}", str::join("\n", linkedTokens));

                if (allLinksKnownInThread(linkedTokens, comment.threadId)) {
                    spdlog::info("No tokens to link");
                    continue;
                }

                std::string reply = replyMessage(linkedTokens);
                spdlog::info("Possible reply:\n{}", reply);

                if (isReplyAllowed(comment)) {
                    reddit->comment(comment.fullName, std::move(reply));
                    spdlog::info("Reply sent");

                    for (const LinkedToken& t : linkedTokens) {
                        index->addToIndex(t);
                    }
                } else {
                    spdlog::info("Reply canceled");
                }
            }
        } catch (std::exception& e) {
            spdlog::error("{}\n", e.what());
        } catch (...) {
            spdlog::critical("Catched unknown error!\n");
        }
        std::this_thread::sleep_for(std::chrono::seconds(2));
    }
}